

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-split-pages.cc
# Opt level: O3

int main(int argc,char **argv)

{
  undefined8 uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long lVar3;
  QPDFPageObjectHelper QVar4;
  char cVar5;
  int iVar6;
  char *pcVar7;
  long *plVar8;
  undefined8 extraout_RAX;
  ostream *poVar9;
  ulong uVar10;
  element_type **ppeVar11;
  long *plVar12;
  int extraout_EDX;
  ulong __val;
  char cVar13;
  bool bVar14;
  long lVar15;
  QPDF inpdf;
  string __str;
  string outfile;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> pages;
  QPDF outpdf;
  undefined1 in_stack_fffffffffffffec8 [16];
  char *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  char *pcVar16;
  uint in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  element_type *in_stack_fffffffffffffef8;
  element_type **local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  element_type *local_d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  long local_98;
  long local_90;
  code *local_80;
  long local_78;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  pcVar7 = (char *)QUtil::getWhoami(*argv);
  if (1 < argc) {
    iVar6 = strcmp(argv[1]," --static-id");
    if (iVar6 == 0) {
      argv = argv + 1;
      static_id = '\x01';
      argc = argc + -1;
    }
    if (argc == 3) {
      pcVar16 = argv[1];
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_50,argv[2],(allocator<char> *)&stack0xfffffffffffffed7);
      QPDF::QPDF((QPDF *)&stack0xfffffffffffffee0);
      QPDF::processFile(&stack0xfffffffffffffee0,pcVar16);
      QPDFPageDocumentHelper::QPDFPageDocumentHelper
                ((QPDFPageDocumentHelper *)&stack0xfffffffffffffee8,(QPDF *)&stack0xfffffffffffffee0
                );
      QPDFPageDocumentHelper::getAllPages();
      QPDFPageDocumentHelper::~QPDFPageDocumentHelper
                ((QPDFPageDocumentHelper *)&stack0xfffffffffffffee8);
      __val = (local_90 - local_98 >> 3) * 0x6db6db6db6db6db7;
      cVar13 = '\x01';
      if (9 < __val) {
        uVar10 = __val;
        cVar5 = '\x04';
        do {
          cVar13 = cVar5;
          if (uVar10 < 100) {
            cVar13 = cVar13 + -2;
            goto LAB_001025ad;
          }
          if (uVar10 < 1000) {
            cVar13 = cVar13 + -1;
            goto LAB_001025ad;
          }
          if (uVar10 < 10000) goto LAB_001025ad;
          bVar14 = 99999 < uVar10;
          uVar10 = uVar10 / 10000;
          cVar5 = cVar13 + '\x04';
        } while (bVar14);
        cVar13 = cVar13 + '\x01';
      }
LAB_001025ad:
      pcVar16 = &stack0xfffffffffffffef8;
      std::__cxx11::string::_M_construct((ulong)&stack0xfffffffffffffee8,cVar13);
      std::__detail::__to_chars_10_impl<unsigned_long>(pcVar16,in_stack_fffffffffffffef0,__val);
      if ((CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0) & 0xffffffff80000000) != 0)
      {
        QIntC::IntConverter<unsigned_long,_int,_false,_true>::error
                  (CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      }
      if (pcVar16 != &stack0xfffffffffffffef8) {
        operator_delete(pcVar16,(ulong)(in_stack_fffffffffffffef8 + 1));
      }
      local_78 = local_90;
      if (local_98 != local_90) {
        iVar6 = 1;
        local_80 = QPDFWriter::write;
        lVar15 = local_98;
        do {
          QUtil::int_to_string_abi_cxx11_((longlong)local_70,iVar6);
          plVar8 = (long *)std::__cxx11::string::replace
                                     ((ulong)local_70,0,(char *)0x0,(ulong)local_50[0]);
          ppeVar11 = (element_type **)(plVar8 + 2);
          if ((element_type **)*plVar8 == ppeVar11) {
            local_d0 = *ppeVar11;
            _Stack_c8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar8[3];
            local_e0 = &local_d0;
          }
          else {
            local_d0 = *ppeVar11;
            local_e0 = (element_type **)*plVar8;
          }
          local_d8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar8[1];
          *plVar8 = (long)ppeVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_e0);
          local_c0 = &local_b0;
          plVar12 = plVar8 + 2;
          if ((long *)*plVar8 == plVar12) {
            local_b0 = *plVar12;
            lStack_a8 = plVar8[3];
          }
          else {
            local_b0 = *plVar12;
            local_c0 = (long *)*plVar8;
          }
          local_b8 = plVar8[1];
          *plVar8 = (long)plVar12;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          if (local_e0 != &local_d0) {
            operator_delete(local_e0,(ulong)(local_d0 + 1));
          }
          if (local_70[0] != local_60) {
            operator_delete(local_70[0],local_60[0] + 1);
          }
          QPDF::QPDF((QPDF *)local_70);
          QPDF::emptyPDF();
          QPDFPageDocumentHelper::QPDFPageDocumentHelper
                    ((QPDFPageDocumentHelper *)&local_e0,(QPDF *)local_70);
          uVar1 = *(undefined8 *)(lVar15 + 8);
          _Var2._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar15 + 0x10);
          if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(_Var2._M_pi + 8) = *(int *)(_Var2._M_pi + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(_Var2._M_pi + 8) = *(int *)(_Var2._M_pi + 8) + 1;
            }
          }
          lVar3 = *(long *)(lVar15 + 0x20);
          if (lVar3 != 0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
            }
          }
          lVar3 = *(long *)(lVar15 + 0x30);
          if (lVar3 != 0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
            }
          }
          QVar4._16_8_ = pcVar7;
          QVar4.super_QPDFObjectHelper = (QPDFObjectHelper)in_stack_fffffffffffffec8[0];
          QVar4._1_8_ = in_stack_fffffffffffffec8._1_8_;
          QVar4._9_7_ = in_stack_fffffffffffffec8._9_7_;
          QVar4._24_8_ = in_stack_fffffffffffffee0;
          QVar4._32_8_ = &PTR__QPDFPageObjectHelper_00104d48;
          QVar4.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr._0_4_ = (int)uVar1;
          QVar4.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr._4_4_ = (int)((ulong)uVar1 >> 0x20);
          QVar4.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = _Var2._M_pi;
          bVar14 = SUB81((QPDFPageDocumentHelper *)&local_e0,0);
          QPDFPageDocumentHelper::addPage(QVar4,bVar14);
          QPDFPageObjectHelper::~QPDFPageObjectHelper
                    ((QPDFPageObjectHelper *)&stack0xfffffffffffffee8);
          QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&local_e0);
          QPDFWriter::QPDFWriter((QPDFWriter *)&local_e0,(QPDF *)local_70,(char *)local_c0);
          if (static_id == '\x01') {
            QPDFWriter::setStaticID(bVar14);
            QPDFWriter::setStreamDataMode((qpdf_stream_data_e)(QPDFPageDocumentHelper *)&local_e0);
          }
          QPDFWriter::write();
          if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
          }
          QPDF::~QPDF((QPDF *)local_70);
          if (local_c0 != &local_b0) {
            operator_delete(local_c0,local_b0 + 1);
          }
          lVar15 = lVar15 + 0x38;
          iVar6 = iVar6 + 1;
        } while (lVar15 != local_78);
      }
      std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
                ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_98);
      QPDF::~QPDF((QPDF *)&stack0xfffffffffffffee0);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      return 0;
    }
  }
  usage(pcVar7);
  if (in_stack_fffffffffffffee8 != pcVar7) {
    operator_delete(in_stack_fffffffffffffee8,(ulong)(in_stack_fffffffffffffef8 + 1));
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_98);
  QPDF::~QPDF((QPDF *)&stack0xfffffffffffffee0);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (extraout_EDX == 1) {
    plVar8 = (long *)__cxa_begin_catch(extraout_RAX);
    poVar9 = std::operator<<((ostream *)&std::cerr,in_stack_fffffffffffffed8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": exception: ",0xd);
    pcVar7 = (char *)(**(code **)(*plVar8 + 0x10))(plVar8);
    poVar9 = std::operator<<(poVar9,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar9);
    __cxa_end_catch();
    return 2;
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int
main(int argc, char* argv[])
{
    char const* whoami = QUtil::getWhoami(argv[0]);

    // For test suite
    if ((argc > 1) && (strcmp(argv[1], " --static-id") == 0)) {
        static_id = true;
        --argc;
        ++argv;
    }

    if (argc != 3) {
        usage(whoami);
    }
    try {
        process(whoami, argv[1], argv[2]);
    } catch (std::exception const& e) {
        std::cerr << whoami << ": exception: " << e.what() << std::endl;
        return 2;
    }
    return 0;
}